

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

bool __thiscall Clasp::UncoreMinimize::handleModel(UncoreMinimize *this,Solver *s)

{
  SharedData *pSVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = (*(this->super_MinimizeConstraint).super_Constraint._vptr_Constraint[6])();
  if (SUB41(iVar2,0) != false) {
    if (*this->sum_ < 0) {
      computeSum(this,s);
    }
    SharedMinimizeData::setOptimum((this->super_MinimizeConstraint).shared_,this->sum_);
    pSVar1 = (this->super_MinimizeConstraint).shared_;
    uVar3 = 0;
    if (pSVar1->mode_ != enumerate) {
      uVar3 = (uint)((pSVar1->gCount_).super___atomic_base<unsigned_int>._M_i != pSVar1->optGen_) <<
              0x1c;
    }
    *(uint *)&this->field_0xec = *(uint *)&this->field_0xec & 0xefffffff | uVar3;
    this->gen_ = (((this->super_MinimizeConstraint).shared_)->gCount_).
                 super___atomic_base<unsigned_int>._M_i;
    pSVar1 = (this->super_MinimizeConstraint).shared_;
    this->upper_ = *(wsum_t *)
                    (*(long *)((long)&pSVar1->up_[0].ebo_.buf +
                              (ulong)(((pSVar1->gCount_).super___atomic_base<unsigned_int>._M_i & 1)
                                     << 4)) + (ulong)(*(uint *)&this->field_0xec & 0xfffffff) * 8);
    if ((((*(uint *)&this->field_0xec & 0x30000000) == 0x10000000) &&
        (this->nextW_ == 0 && (this->todo_).next_ == 0)) &&
       (this->lower_ != this->sum_[*(uint *)&this->field_0xec & 0xfffffff])) {
      Potassco::fail(-1,"virtual bool Clasp::UncoreMinimize::handleModel(Solver &)",0x43e,
                     "!next_ || disj_ || todo_.shrink() || nextW_ || lower_ == sum_[level_]",
                     "Unexpected lower bound on model!",0);
    }
  }
  return SUB41(iVar2,0);
}

Assistant:

bool UncoreMinimize::handleModel(Solver& s) {
	if (!valid(s))  { return false; }
	if (sum_[0] < 0){ computeSum(s);}
	shared_->setOptimum(sum_);
	next_ = shared_->checkNext();
	gen_  = shared_->generation();
	upper_= shared_->upper(level_);
	POTASSCO_ASSERT(!next_ || disj_ || todo_.shrink() || nextW_ || lower_ == sum_[level_], "Unexpected lower bound on model!");
	return true;
}